

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

size_t uv__min_stack_size(void)

{
  ulong uVar1;
  undefined8 local_10;
  
  uVar1 = __sysconf(0x4b);
  if (uVar1 < 0x2001) {
    local_10 = 0x2000;
  }
  else {
    local_10 = __sysconf(0x4b);
  }
  return local_10;
}

Assistant:

static size_t uv__min_stack_size(void) {
  static const size_t min = 8192;

#ifdef PTHREAD_STACK_MIN  /* Not defined on NetBSD. */
  if (min < (size_t) PTHREAD_STACK_MIN)
    return PTHREAD_STACK_MIN;
#endif  /* PTHREAD_STACK_MIN */

  return min;
}